

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::on_error(session_impl *this,error_code *ec)

{
  int iVar1;
  uint uVar2;
  error_category *peVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  string local_38;
  error_code *local_18;
  error_code *ec_local;
  session_impl *this_local;
  
  local_18 = ec;
  ec_local = (error_code *)this;
  peVar3 = boost::system::error_code::category(ec);
  iVar1 = (**peVar3->_vptr_error_category)();
  uVar2 = boost::system::error_code::value(local_18);
  boost::system::error_code::message_abi_cxx11_(&local_38,local_18);
  uVar4 = ::std::__cxx11::string::c_str();
  session_log(this,"FATAL SESSION ERROR (%s : %d) [%s]",CONCAT44(extraout_var,iVar1),(ulong)uVar2,
              uVar4);
  ::std::__cxx11::string::~string((string *)&local_38);
  abort(this);
  return;
}

Assistant:

void session_impl::on_error(error_code const& ec)
	{
		TORRENT_UNUSED(ec);
#ifndef TORRENT_DISABLE_LOGGING
		session_log("FATAL SESSION ERROR (%s : %d) [%s]"
			, ec.category().name(), ec.value(), ec.message().c_str());
#endif
		this->abort();
	}